

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::PrintNestedBuilderCondition
          (ImmutableMessageFieldGenerator *this,Printer *printer,char *regular_case,
          char *nested_builder_case)

{
  char *pcVar1;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  char *local_28;
  char *nested_builder_case_local;
  char *regular_case_local;
  Printer *printer_local;
  ImmutableMessageFieldGenerator *this_local;
  
  local_28 = nested_builder_case;
  nested_builder_case_local = regular_case;
  regular_case_local = (char *)printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"if ($name$Builder_ == null) {\n");
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_38);
  io::Printer::Indent((Printer *)regular_case_local);
  pcVar1 = regular_case_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,nested_builder_case_local);
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)pcVar1,&this->variables_,local_48);
  google::protobuf::io::Printer::Outdent();
  pcVar1 = regular_case_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"} else {\n");
  io::Printer::Print<>((Printer *)pcVar1,local_58);
  io::Printer::Indent((Printer *)regular_case_local);
  pcVar1 = regular_case_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,local_28);
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)pcVar1,&this->variables_,local_68);
  google::protobuf::io::Printer::Outdent();
  pcVar1 = regular_case_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"}\n");
  io::Printer::Print<>((Printer *)pcVar1,local_78);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::PrintNestedBuilderCondition(
    io::Printer* printer, const char* regular_case,
    const char* nested_builder_case) const {
  printer->Print(variables_, "if ($name$Builder_ == null) {\n");
  printer->Indent();
  printer->Print(variables_, regular_case);
  printer->Outdent();
  printer->Print("} else {\n");
  printer->Indent();
  printer->Print(variables_, nested_builder_case);
  printer->Outdent();
  printer->Print("}\n");
}